

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLexer.cpp
# Opt level: O3

void __thiscall json::JsonToken::JsonToken(JsonToken *this,JsonTokenType type,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->type = type;
  paVar1 = &(this->value).field_2;
  (this->value)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (value->_M_dataplus)._M_p;
  paVar2 = &value->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&value->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->value).field_2 + 8) = uVar4;
  }
  else {
    (this->value)._M_dataplus._M_p = pcVar3;
    (this->value).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->value)._M_string_length = value->_M_string_length;
  (value->_M_dataplus)._M_p = (pointer)paVar2;
  value->_M_string_length = 0;
  (value->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

JsonToken::JsonToken(JsonTokenType type, std::string &&value) : type(type), value(std::move(value))
    {
    }